

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4> __thiscall
embree::avx::GeneralBVHBuilder::
BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::avx::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>,_embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::avx::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::avx::CreateLeafSpatial<4,_embree::TriangleMi<4>_>_>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::avx::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  extended_range<unsigned_long> *range;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  Vec3fa VVar4;
  undefined4 uVar5;
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 uVar6;
  unsigned_long uVar7;
  size_t i;
  long lVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar9;
  NodeRefPtr<4> NVar10;
  size_t sVar11;
  undefined8 *puVar12;
  unsigned_long *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  *current_00;
  undefined1 auVar20 [32];
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  ThreadLocal2 *local_838;
  ThreadLocal2 *local_830;
  ThreadLocal2 *local_828;
  bool local_820;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_818;
  undefined4 local_808;
  undefined4 uStack_804;
  undefined4 uStack_800;
  undefined4 uStack_7fc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_7f8;
  undefined4 local_7e8;
  undefined4 uStack_7e4;
  undefined4 uStack_7e0;
  undefined4 uStack_7dc;
  unsigned_long local_7d8;
  unsigned_long uStack_7d0;
  unsigned_long local_7c8;
  ThreadLocal2 *local_7a8;
  bool local_7a0 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_798;
  undefined4 local_788;
  undefined4 uStack_784;
  undefined4 uStack_780;
  undefined4 uStack_77c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_778;
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  unsigned_long local_758 [4];
  BuildRecordT<embree::avx::PrimInfoExtRange,_embree::avx::Split2<embree::avx::BinSplit<32UL>,_embree::avx::SpatialBinSplit<16UL>_>_>
  local_738 [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_738[0].depth = (size_t)&local_738[0].prims;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"depth limit reached","");
    *puVar12 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar12 + 1) = 1;
    puVar12[2] = puVar12 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 2),local_738[0].depth,
               (long)&(((CentGeomBBox3fa *)local_738[0].depth)->geomBounds).lower.field_0 +
               CONCAT71(local_738[0]._9_7_,local_738[0].alloc_barrier));
    __cxa_throw(puVar12,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  range = &(current->prims).super_extended_range<unsigned_long>;
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar10 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<4>,embree::avx::CreateLeafSpatial<4,embree::TriangleMi<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<4>,embree::avx::CreateLeafSpatial<4,embree::TriangleMi<4>>>
                           *)this->createLeaf,this->prims,&range->super_range<unsigned_long>,alloc);
    return (NodeRefPtr<4>)NVar10.ptr;
  }
  local_738[0].alloc_barrier = current->alloc_barrier;
  local_738[0].depth = current->depth;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0 + 8);
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
       (range->super_range<unsigned_long>)._begin;
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
       (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  local_738[0].prims.super_extended_range<unsigned_long>._ext_end =
       (current->prims).super_extended_range<unsigned_long>._ext_end;
  uVar19 = 1;
  do {
    if (uVar19 == 0) {
      uVar15 = 0xffffffffffffffff;
    }
    else {
      uVar15 = 0xffffffffffffffff;
      puVar13 = &local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
                 _end;
      uVar14 = 0;
      uVar16 = 0;
      do {
        uVar17 = *puVar13 - ((range<unsigned_long> *)(puVar13 + -1))->_begin;
        if (((this->cfg).maxLeafSize < uVar17) && (uVar16 < uVar17)) {
          uVar15 = uVar14;
          uVar16 = uVar17;
        }
        uVar14 = uVar14 + 1;
        puVar13 = puVar13 + 0xe;
      } while (uVar19 != uVar14);
    }
    if (uVar15 == 0xffffffffffffffff) break;
    local_828 = (ThreadLocal2 *)(current->depth + 1);
    local_820 = false;
    local_818.m128[2] = INFINITY;
    local_818._0_8_ = 0x7f8000007f800000;
    local_818.m128[3] = INFINITY;
    local_808 = 0xff800000;
    uStack_804 = 0xff800000;
    uStack_800 = 0xff800000;
    uStack_7fc = 0xff800000;
    local_7e8 = 0xff800000;
    uStack_7e4 = 0xff800000;
    uStack_7e0 = 0xff800000;
    uStack_7dc = 0xff800000;
    local_7c8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7a0[0] = false;
    local_788 = 0xff800000;
    uStack_784 = 0xff800000;
    uStack_780 = 0xff800000;
    uStack_77c = 0xff800000;
    local_768 = 0xff800000;
    uStack_764 = 0xff800000;
    uStack_760 = 0xff800000;
    uStack_75c = 0xff800000;
    local_758[2] = 0;
    local_758[0] = 0;
    local_758[1] = 0;
    local_7f8 = local_818;
    local_7a8 = local_828;
    local_798 = local_818;
    local_778 = local_818;
    HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&local_738[uVar15].prims,(PrimInfoExtRange *)&local_818.field_1,
                  (PrimInfoExtRange *)&local_798.field_1);
    lVar8 = uVar19 * 0x70;
    local_738[uVar15].alloc_barrier = local_7a0[lVar8];
    local_738[uVar15].depth = *(size_t *)(local_7a0 + lVar8 + -8);
    uVar6 = *(undefined8 *)((long)&local_798 + lVar8 + 8);
    *(undefined8 *)&local_738[uVar15].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         *(undefined8 *)(&local_798 + uVar19 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar15].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)(&uStack_780 + uVar19 * 0x1c);
    *(undefined8 *)&local_738[uVar15].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         *(undefined8 *)(&local_788 + uVar19 * 0x1c);
    *(undefined8 *)
     ((long)&local_738[uVar15].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&local_778 + lVar8 + 8);
    *(undefined8 *)&local_738[uVar15].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         *(undefined8 *)(&local_778 + uVar19 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar15].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) = uVar6;
    uVar7 = local_758[uVar19 * 0xe + -1];
    *(undefined8 *)&local_738[uVar15].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         *(undefined8 *)(&local_768 + uVar19 * 0x1c);
    *(unsigned_long *)
     ((long)&local_738[uVar15].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) = uVar7;
    uVar7 = local_738[uVar19 - 1].prims.super_extended_range<unsigned_long>.
            super_range<unsigned_long>._end;
    local_738[uVar15].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_758[uVar19 * 0xe];
    local_738[uVar15].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uVar7;
    local_738[uVar15].prims.super_extended_range<unsigned_long>._ext_end =
         local_738[uVar19 - 1].prims.super_extended_range<unsigned_long>._ext_end;
    *(ThreadLocal2 **)(local_7a0 + lVar8 + -8) = local_828;
    local_7a0[lVar8] = local_820;
    *(undefined8 *)(&local_798 + uVar19 * 7) = local_818._0_8_;
    *(undefined8 *)((long)&local_798 + lVar8 + 8) = local_818._8_8_;
    *(ulong *)(&local_788 + uVar19 * 0x1c) = CONCAT44(uStack_804,local_808);
    *(ulong *)(&uStack_780 + uVar19 * 0x1c) = CONCAT44(uStack_7fc,uStack_800);
    *(undefined8 *)(&local_778 + uVar19 * 7) = local_7f8._0_8_;
    *(undefined8 *)((long)&local_778 + lVar8 + 8) = local_7f8._8_8_;
    *(ulong *)(&local_768 + uVar19 * 0x1c) = CONCAT44(uStack_7e4,local_7e8);
    local_758[uVar19 * 0xe + -1] = CONCAT44(uStack_7dc,uStack_7e0);
    local_738[uVar19 - 1].prims.super_extended_range<unsigned_long>._ext_end = local_7c8;
    local_758[uVar19 * 0xe] = local_7d8;
    local_738[uVar19 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
         = uStack_7d0;
    local_738[uVar19].alloc_barrier = local_7a0[0];
    local_738[uVar19].depth = (size_t)local_7a8;
    *(undefined8 *)&local_738[uVar19].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         local_798._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar19].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) =
         local_798._8_8_;
    *(ulong *)&local_738[uVar19].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         CONCAT44(uStack_784,local_788);
    *(ulong *)((long)&local_738[uVar19].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) =
         CONCAT44(uStack_77c,uStack_780);
    *(undefined8 *)&local_738[uVar19].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         local_778._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar19].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) =
         local_778._8_8_;
    *(ulong *)&local_738[uVar19].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         CONCAT44(uStack_764,local_768);
    *(ulong *)((long)&local_738[uVar19].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) =
         CONCAT44(uStack_75c,uStack_760);
    local_738[uVar19].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_758[0];
    local_738[uVar19].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         local_758[1];
    local_738[uVar19].prims.super_extended_range<unsigned_long>._ext_end = local_758[2];
    uVar19 = uVar19 + 1;
  } while (uVar19 < (this->cfg).branchingFactor);
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::avx::GeneralBVHBuilder::BuildRecordT<embree::avx::PrimInfoExtRange,embree::avx::Split2<embree::avx::BinSplit<32ul>,embree::avx::SpatialBinSplit<16ul>>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::avx::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<4>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::avx::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::avx::CreateLeafSpatial<4,embree::TriangleMi<4>>>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::avx::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::avx::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  local_838 = (ThreadLocal2 *)0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_7a0[0] = true;
    local_7a8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar20._0_8_;
    (this_00->alloc0).allocBlockSize = auVar20._8_8_;
    (this_00->alloc0).bytesUsed = auVar20._16_8_;
    (this_00->alloc0).bytesWasted = auVar20._24_8_;
    (this_00->alloc0).ptr = (char *)auVar20._0_8_;
    (this_00->alloc0).cur = auVar20._8_8_;
    (this_00->alloc0).end = auVar20._16_8_;
    (this_00->alloc0).allocBlockSize = auVar20._24_8_;
    auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar20._0_8_;
      (this_00->alloc1).allocBlockSize = auVar20._8_8_;
      (this_00->alloc1).bytesUsed = auVar20._16_8_;
      (this_00->alloc1).bytesWasted = auVar20._24_8_;
      (this_00->alloc1).ptr = (char *)auVar20._0_8_;
      (this_00->alloc1).cur = auVar20._8_8_;
      (this_00->alloc1).end = auVar20._16_8_;
      (this_00->alloc1).allocBlockSize = auVar20._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar20._0_8_;
      (this_00->alloc1).cur = auVar20._8_8_;
      (this_00->alloc1).end = auVar20._16_8_;
      (this_00->alloc1).allocBlockSize = auVar20._24_8_;
      (this_00->alloc1).end = auVar20._0_8_;
      (this_00->alloc1).allocBlockSize = auVar20._8_8_;
      (this_00->alloc1).bytesUsed = auVar20._16_8_;
      (this_00->alloc1).bytesWasted = auVar20._24_8_;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_828 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_820 = true;
    local_830 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_830);
    }
    else {
      *__position._M_current = local_830;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_820 == true) {
      MutexSys::unlock(&local_828->mutex);
    }
    if (local_7a0[0] == true) {
      MutexSys::unlock(&local_7a8->mutex);
    }
  }
  (alloc.talloc0)->bytesUsed = (long)&(local_838->mutex).mutex + (alloc.talloc0)->bytesUsed;
  sVar11 = (alloc.talloc0)->cur;
  uVar15 = (ulong)(-(int)sVar11 & 0xf);
  uVar16 = (long)&(local_838->mutex).mutex + uVar15 + sVar11;
  (alloc.talloc0)->cur = uVar16;
  if ((alloc.talloc0)->end < uVar16) {
    (alloc.talloc0)->cur = sVar11;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_838 << 2)) {
      pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
    else {
      local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
      (alloc.talloc0)->ptr = pcVar18;
      sVar11 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar11;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = (size_t)local_828;
      (alloc.talloc0)->cur = (size_t)local_838;
      if (local_828 < local_838) {
        (alloc.talloc0)->cur = 0;
        local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
        (alloc.talloc0)->ptr = pcVar18;
        sVar11 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar11;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = (size_t)local_828;
        (alloc.talloc0)->cur = (size_t)local_838;
        if (local_828 < local_838) {
          (alloc.talloc0)->cur = 0;
          pcVar18 = (char *)0x0;
          goto LAB_013b4e54;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar11;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar15;
    pcVar18 = (alloc.talloc0)->ptr + (uVar16 - (long)local_838);
  }
LAB_013b4e54:
  pcVar18[0x60] = '\0';
  pcVar18[0x61] = '\0';
  pcVar18[0x62] = -0x80;
  pcVar18[99] = '\x7f';
  pcVar18[100] = '\0';
  pcVar18[0x65] = '\0';
  pcVar18[0x66] = -0x80;
  pcVar18[0x67] = '\x7f';
  pcVar18[0x68] = '\0';
  pcVar18[0x69] = '\0';
  pcVar18[0x6a] = -0x80;
  pcVar18[0x6b] = '\x7f';
  pcVar18[0x6c] = '\0';
  pcVar18[0x6d] = '\0';
  pcVar18[0x6e] = -0x80;
  pcVar18[0x6f] = '\x7f';
  pcVar18[0x40] = '\0';
  pcVar18[0x41] = '\0';
  pcVar18[0x42] = -0x80;
  pcVar18[0x43] = '\x7f';
  pcVar18[0x44] = '\0';
  pcVar18[0x45] = '\0';
  pcVar18[0x46] = -0x80;
  pcVar18[0x47] = '\x7f';
  pcVar18[0x48] = '\0';
  pcVar18[0x49] = '\0';
  pcVar18[0x4a] = -0x80;
  pcVar18[0x4b] = '\x7f';
  pcVar18[0x4c] = '\0';
  pcVar18[0x4d] = '\0';
  pcVar18[0x4e] = -0x80;
  pcVar18[0x4f] = '\x7f';
  pcVar18[0x20] = '\0';
  pcVar18[0x21] = '\0';
  pcVar18[0x22] = -0x80;
  pcVar18[0x23] = '\x7f';
  pcVar18[0x24] = '\0';
  pcVar18[0x25] = '\0';
  pcVar18[0x26] = -0x80;
  pcVar18[0x27] = '\x7f';
  pcVar18[0x28] = '\0';
  pcVar18[0x29] = '\0';
  pcVar18[0x2a] = -0x80;
  pcVar18[0x2b] = '\x7f';
  pcVar18[0x2c] = '\0';
  pcVar18[0x2d] = '\0';
  pcVar18[0x2e] = -0x80;
  pcVar18[0x2f] = '\x7f';
  pcVar18[0x70] = '\0';
  pcVar18[0x71] = '\0';
  pcVar18[0x72] = -0x80;
  pcVar18[0x73] = -1;
  pcVar18[0x74] = '\0';
  pcVar18[0x75] = '\0';
  pcVar18[0x76] = -0x80;
  pcVar18[0x77] = -1;
  pcVar18[0x78] = '\0';
  pcVar18[0x79] = '\0';
  pcVar18[0x7a] = -0x80;
  pcVar18[0x7b] = -1;
  pcVar18[0x7c] = '\0';
  pcVar18[0x7d] = '\0';
  pcVar18[0x7e] = -0x80;
  pcVar18[0x7f] = -1;
  pcVar18[0x50] = '\0';
  pcVar18[0x51] = '\0';
  pcVar18[0x52] = -0x80;
  pcVar18[0x53] = -1;
  pcVar18[0x54] = '\0';
  pcVar18[0x55] = '\0';
  pcVar18[0x56] = -0x80;
  pcVar18[0x57] = -1;
  pcVar18[0x58] = '\0';
  pcVar18[0x59] = '\0';
  pcVar18[0x5a] = -0x80;
  pcVar18[0x5b] = -1;
  pcVar18[0x5c] = '\0';
  pcVar18[0x5d] = '\0';
  pcVar18[0x5e] = -0x80;
  pcVar18[0x5f] = -1;
  pcVar18[0x30] = '\0';
  pcVar18[0x31] = '\0';
  pcVar18[0x32] = -0x80;
  pcVar18[0x33] = -1;
  pcVar18[0x34] = '\0';
  pcVar18[0x35] = '\0';
  pcVar18[0x36] = -0x80;
  pcVar18[0x37] = -1;
  pcVar18[0x38] = '\0';
  pcVar18[0x39] = '\0';
  pcVar18[0x3a] = -0x80;
  pcVar18[0x3b] = -1;
  pcVar18[0x3c] = '\0';
  pcVar18[0x3d] = '\0';
  pcVar18[0x3e] = -0x80;
  pcVar18[0x3f] = -1;
  pcVar18[0] = '\b';
  pcVar18[1] = '\0';
  pcVar18[2] = '\0';
  pcVar18[3] = '\0';
  pcVar18[4] = '\0';
  pcVar18[5] = '\0';
  pcVar18[6] = '\0';
  pcVar18[7] = '\0';
  pcVar18[8] = '\b';
  pcVar18[9] = '\0';
  pcVar18[10] = '\0';
  pcVar18[0xb] = '\0';
  pcVar18[0xc] = '\0';
  pcVar18[0xd] = '\0';
  pcVar18[0xe] = '\0';
  pcVar18[0xf] = '\0';
  pcVar18[0x10] = '\b';
  pcVar18[0x11] = '\0';
  pcVar18[0x12] = '\0';
  pcVar18[0x13] = '\0';
  pcVar18[0x14] = '\0';
  pcVar18[0x15] = '\0';
  pcVar18[0x16] = '\0';
  pcVar18[0x17] = '\0';
  pcVar18[0x18] = '\b';
  pcVar18[0x19] = '\0';
  pcVar18[0x1a] = '\0';
  pcVar18[0x1b] = '\0';
  pcVar18[0x1c] = '\0';
  pcVar18[0x1d] = '\0';
  pcVar18[0x1e] = '\0';
  pcVar18[0x1f] = '\0';
  if (uVar19 != 0) {
    paVar9 = &local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0;
    uVar15 = 0;
    do {
      auVar3 = *(undefined1 (*) [16])paVar9[-1].m128;
      VVar4.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar9->m128;
      *(int *)(pcVar18 + uVar15 * 4 + 0x20) = auVar3._0_4_;
      uVar5 = vextractps_avx(auVar3,1);
      *(undefined4 *)(pcVar18 + uVar15 * 4 + 0x40) = uVar5;
      uVar5 = vextractps_avx(auVar3,2);
      *(undefined4 *)(pcVar18 + uVar15 * 4 + 0x60) = uVar5;
      *(int *)(pcVar18 + uVar15 * 4 + 0x30) = VVar4.field_0._0_4_;
      uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
      *(undefined4 *)(pcVar18 + uVar15 * 4 + 0x50) = uVar5;
      uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
      *(undefined4 *)(pcVar18 + uVar15 * 4 + 0x70) = uVar5;
      uVar15 = uVar15 + 1;
      paVar9 = paVar9 + 7;
    } while (uVar19 != uVar15);
  }
  if (uVar19 != 0) {
    current_00 = local_738;
    uVar15 = 0;
    do {
      NVar10 = createLargeLeaf(this,current_00,alloc);
      (&local_828)[uVar15] = (ThreadLocal2 *)NVar10.ptr;
      uVar15 = uVar15 + 1;
      current_00 = current_00 + 1;
    } while (uVar19 != uVar15);
    uVar15 = 0;
    do {
      *(ThreadLocal2 **)(pcVar18 + uVar15 * 8) = (&local_828)[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar19 != uVar15);
  }
  return (NodeRefPtr<4>)(size_t)pcVar18;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }